

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::ImmediatePromiseNode<unsigned_int>_> __thiscall
kj::heap<kj::_::ImmediatePromiseNode<unsigned_int>,unsigned_int>(kj *this,uint *params)

{
  ImmediatePromiseNode<unsigned_int> *this_00;
  uint *value;
  ImmediatePromiseNode<unsigned_int> *extraout_RDX;
  Own<kj::_::ImmediatePromiseNode<unsigned_int>_> OVar1;
  ExceptionOr<unsigned_int> local_180;
  NoInfer<unsigned_int> *local_18;
  uint *params_local;
  
  local_18 = params;
  params_local = (uint *)this;
  this_00 = (ImmediatePromiseNode<unsigned_int> *)operator_new(0x170);
  value = fwd<unsigned_int>(local_18);
  _::ExceptionOr<unsigned_int>::ExceptionOr(&local_180,value);
  _::ImmediatePromiseNode<unsigned_int>::ImmediatePromiseNode(this_00,&local_180);
  Own<kj::_::ImmediatePromiseNode<unsigned_int>_>::Own
            ((Own<kj::_::ImmediatePromiseNode<unsigned_int>_> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::_::ImmediatePromiseNode<unsigned_int>>::instance);
  _::ExceptionOr<unsigned_int>::~ExceptionOr(&local_180);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}